

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::DeferredFailIfUnicode
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,HRESULT error)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseError *this_00;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x23e,"(this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                       "this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
    if (!bVar2) goto LAB_00ec117e;
    *puVar4 = 0;
  }
  if (this->deferredIfUnicodeError == (ParseError *)0x0) {
    this_00 = (ParseError *)new<Memory::ArenaAllocator>(0x10,this->ctAllocator,0x364470);
    bVar2 = this->inBody;
    uVar5 = (long)this->next - (long)this->input;
    if (this->next < this->input || 0x7ffffffe < (long)uVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                         "ph >= pl && ph - pl <= MaxCharCount");
      if (!bVar3) goto LAB_00ec117e;
      *puVar4 = 0;
    }
    uVar7 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
    if ((uVar5 & 0xffffffff) < uVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xb0,"(nextOffset >= this->m_cMultiUnits)",
                         "nextOffset >= this->m_cMultiUnits");
      if (!bVar3) goto LAB_00ec117e;
      *puVar4 = 0;
      uVar7 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
    }
    lVar6 = (long)this->next - (long)this->input;
    if (this->next < this->input || 0x7ffffffe < lVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                         "ph >= pl && ph - pl <= MaxCharCount");
      if (!bVar3) {
LAB_00ec117e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    ParseError::ParseError(this_00,bVar2,(int)uVar5 - (int)uVar7,(CharCount)lVar6,error);
    this->deferredIfUnicodeError = this_00;
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::DeferredFailIfUnicode(HRESULT error)
    {
        Assert(this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());
        if (this->deferredIfUnicodeError == nullptr)
        {
            this->deferredIfUnicodeError = Anew(ctAllocator, ParseError, inBody, Pos(), Chars<EncodedChar>::OSB(next, input), error);
        }
    }